

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script_error.cpp
# Opt level: O3

string * ScriptErrorString_abi_cxx11_(string *__return_storage_ptr__,ScriptError serror)

{
  long lVar1;
  char *pcVar2;
  char *pcVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  switch(serror) {
  case SCRIPT_ERR_OK:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "No error";
      pcVar2 = "";
LAB_0083135f:
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)__return_storage_ptr__,pcVar3,pcVar2);
      return __return_storage_ptr__;
    }
    break;
  default:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "unknown error";
      pcVar2 = "";
      goto LAB_0083135f;
    }
    break;
  case SCRIPT_ERR_EVAL_FALSE:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "Script evaluated without error but finished with a false/empty top stack element";
      pcVar2 = "";
      goto LAB_0083135f;
    }
    break;
  case SCRIPT_ERR_OP_RETURN:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "OP_RETURN was encountered";
      pcVar2 = "";
      goto LAB_0083135f;
    }
    break;
  case SCRIPT_ERR_SCRIPT_SIZE:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "Script is too big";
      pcVar2 = "";
      goto LAB_0083135f;
    }
    break;
  case SCRIPT_ERR_PUSH_SIZE:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "Push value size limit exceeded";
      pcVar2 = "";
      goto LAB_0083135f;
    }
    break;
  case SCRIPT_ERR_OP_COUNT:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "Operation limit exceeded";
      pcVar2 = "";
      goto LAB_0083135f;
    }
    break;
  case SCRIPT_ERR_STACK_SIZE:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "Stack size limit exceeded";
      pcVar2 = "";
      goto LAB_0083135f;
    }
    break;
  case SCRIPT_ERR_SIG_COUNT:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "Signature count negative or greater than pubkey count";
      pcVar2 = "";
      goto LAB_0083135f;
    }
    break;
  case SCRIPT_ERR_PUBKEY_COUNT:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "Pubkey count negative or limit exceeded";
      pcVar2 = "";
      goto LAB_0083135f;
    }
    break;
  case SCRIPT_ERR_VERIFY:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "Script failed an OP_VERIFY operation";
      pcVar2 = "";
      goto LAB_0083135f;
    }
    break;
  case SCRIPT_ERR_EQUALVERIFY:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "Script failed an OP_EQUALVERIFY operation";
      pcVar2 = "";
      goto LAB_0083135f;
    }
    break;
  case SCRIPT_ERR_CHECKMULTISIGVERIFY:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "Script failed an OP_CHECKMULTISIGVERIFY operation";
      pcVar2 = "";
      goto LAB_0083135f;
    }
    break;
  case SCRIPT_ERR_CHECKSIGVERIFY:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "Script failed an OP_CHECKSIGVERIFY operation";
      pcVar2 = "";
      goto LAB_0083135f;
    }
    break;
  case SCRIPT_ERR_NUMEQUALVERIFY:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "Script failed an OP_NUMEQUALVERIFY operation";
      pcVar2 = "";
      goto LAB_0083135f;
    }
    break;
  case SCRIPT_ERR_BAD_OPCODE:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "Opcode missing or not understood";
      pcVar2 = "";
      goto LAB_0083135f;
    }
    break;
  case SCRIPT_ERR_DISABLED_OPCODE:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "Attempted to use a disabled opcode";
      pcVar2 = "";
      goto LAB_0083135f;
    }
    break;
  case SCRIPT_ERR_INVALID_STACK_OPERATION:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "Operation not valid with the current stack size";
      pcVar2 = "";
      goto LAB_0083135f;
    }
    break;
  case SCRIPT_ERR_INVALID_ALTSTACK_OPERATION:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "Operation not valid with the current altstack size";
      pcVar2 = "";
      goto LAB_0083135f;
    }
    break;
  case SCRIPT_ERR_UNBALANCED_CONDITIONAL:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "Invalid OP_IF construction";
      pcVar2 = "";
      goto LAB_0083135f;
    }
    break;
  case SCRIPT_ERR_NEGATIVE_LOCKTIME:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "Negative locktime";
      pcVar2 = "";
      goto LAB_0083135f;
    }
    break;
  case SCRIPT_ERR_UNSATISFIED_LOCKTIME:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "Locktime requirement not satisfied";
      pcVar2 = "";
      goto LAB_0083135f;
    }
    break;
  case SCRIPT_ERR_SIG_HASHTYPE:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "Signature hash type missing or not understood";
      pcVar2 = "";
      goto LAB_0083135f;
    }
    break;
  case SCRIPT_ERR_SIG_DER:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "Non-canonical DER signature";
      pcVar2 = "";
      goto LAB_0083135f;
    }
    break;
  case SCRIPT_ERR_MINIMALDATA:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "Data push larger than necessary";
      pcVar2 = "";
      goto LAB_0083135f;
    }
    break;
  case SCRIPT_ERR_SIG_PUSHONLY:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "Only push operators allowed in signatures";
      pcVar2 = "";
      goto LAB_0083135f;
    }
    break;
  case SCRIPT_ERR_SIG_HIGH_S:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "Non-canonical signature: S value is unnecessarily high";
      pcVar2 = "";
      goto LAB_0083135f;
    }
    break;
  case SCRIPT_ERR_SIG_NULLDUMMY:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "Dummy CHECKMULTISIG argument must be zero";
      pcVar2 = "";
      goto LAB_0083135f;
    }
    break;
  case SCRIPT_ERR_PUBKEYTYPE:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "Public key is neither compressed or uncompressed";
      pcVar2 = "";
      goto LAB_0083135f;
    }
    break;
  case SCRIPT_ERR_CLEANSTACK:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "Stack size must be exactly one after execution";
      pcVar2 = "";
      goto LAB_0083135f;
    }
    break;
  case SCRIPT_ERR_MINIMALIF:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "OP_IF/NOTIF argument must be minimal";
      pcVar2 = "";
      goto LAB_0083135f;
    }
    break;
  case SCRIPT_ERR_SIG_NULLFAIL:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "Signature must be zero for failed CHECK(MULTI)SIG operation";
      pcVar2 = "";
      goto LAB_0083135f;
    }
    break;
  case SCRIPT_ERR_DISCOURAGE_UPGRADABLE_NOPS:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "NOPx reserved for soft-fork upgrades";
      pcVar2 = "";
      goto LAB_0083135f;
    }
    break;
  case SCRIPT_ERR_DISCOURAGE_UPGRADABLE_WITNESS_PROGRAM:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "Witness version reserved for soft-fork upgrades";
      pcVar2 = "";
      goto LAB_0083135f;
    }
    break;
  case SCRIPT_ERR_DISCOURAGE_UPGRADABLE_TAPROOT_VERSION:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "Taproot version reserved for soft-fork upgrades";
      pcVar2 = "";
      goto LAB_0083135f;
    }
    break;
  case SCRIPT_ERR_DISCOURAGE_OP_SUCCESS:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "OP_SUCCESSx reserved for soft-fork upgrades";
      pcVar2 = "";
      goto LAB_0083135f;
    }
    break;
  case SCRIPT_ERR_DISCOURAGE_UPGRADABLE_PUBKEYTYPE:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "Public key version reserved for soft-fork upgrades";
      pcVar2 = "";
      goto LAB_0083135f;
    }
    break;
  case SCRIPT_ERR_WITNESS_PROGRAM_WRONG_LENGTH:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "Witness program has incorrect length";
      pcVar2 = "";
      goto LAB_0083135f;
    }
    break;
  case SCRIPT_ERR_WITNESS_PROGRAM_WITNESS_EMPTY:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "Witness program was passed an empty witness";
      pcVar2 = "";
      goto LAB_0083135f;
    }
    break;
  case SCRIPT_ERR_WITNESS_PROGRAM_MISMATCH:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "Witness program hash mismatch";
      pcVar2 = "";
      goto LAB_0083135f;
    }
    break;
  case SCRIPT_ERR_WITNESS_MALLEATED:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "Witness requires empty scriptSig";
      pcVar2 = "";
      goto LAB_0083135f;
    }
    break;
  case SCRIPT_ERR_WITNESS_MALLEATED_P2SH:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "Witness requires only-redeemscript scriptSig";
      pcVar2 = "";
      goto LAB_0083135f;
    }
    break;
  case SCRIPT_ERR_WITNESS_UNEXPECTED:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "Witness provided for non-witness script";
      pcVar2 = "";
      goto LAB_0083135f;
    }
    break;
  case SCRIPT_ERR_WITNESS_PUBKEYTYPE:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "Using non-compressed keys in segwit";
      pcVar2 = "";
      goto LAB_0083135f;
    }
    break;
  case SCRIPT_ERR_SCHNORR_SIG_SIZE:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "Invalid Schnorr signature size";
      pcVar2 = "";
      goto LAB_0083135f;
    }
    break;
  case SCRIPT_ERR_SCHNORR_SIG_HASHTYPE:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "Invalid Schnorr signature hash type";
      pcVar2 = "";
      goto LAB_0083135f;
    }
    break;
  case SCRIPT_ERR_SCHNORR_SIG:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "Invalid Schnorr signature";
      pcVar2 = "";
      goto LAB_0083135f;
    }
    break;
  case SCRIPT_ERR_TAPROOT_WRONG_CONTROL_SIZE:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "Invalid Taproot control block size";
      pcVar2 = "";
      goto LAB_0083135f;
    }
    break;
  case SCRIPT_ERR_TAPSCRIPT_VALIDATION_WEIGHT:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "Too much signature validation relative to witness weight";
      pcVar2 = "";
      goto LAB_0083135f;
    }
    break;
  case SCRIPT_ERR_TAPSCRIPT_CHECKMULTISIG:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "OP_CHECKMULTISIG(VERIFY) is not available in tapscript";
      pcVar2 = "";
      goto LAB_0083135f;
    }
    break;
  case SCRIPT_ERR_TAPSCRIPT_MINIMALIF:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "OP_IF/NOTIF argument must be minimal in tapscript";
      pcVar2 = "";
      goto LAB_0083135f;
    }
    break;
  case SCRIPT_ERR_OP_CODESEPARATOR:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "Using OP_CODESEPARATOR in non-witness script";
      pcVar2 = "";
      goto LAB_0083135f;
    }
    break;
  case SCRIPT_ERR_SIG_FINDANDDELETE:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pcVar3 = "Signature is found in scriptCode";
      pcVar2 = "";
      goto LAB_0083135f;
    }
  }
  __stack_chk_fail();
}

Assistant:

std::string ScriptErrorString(const ScriptError serror)
{
    switch (serror)
    {
        case SCRIPT_ERR_OK:
            return "No error";
        case SCRIPT_ERR_EVAL_FALSE:
            return "Script evaluated without error but finished with a false/empty top stack element";
        case SCRIPT_ERR_VERIFY:
            return "Script failed an OP_VERIFY operation";
        case SCRIPT_ERR_EQUALVERIFY:
            return "Script failed an OP_EQUALVERIFY operation";
        case SCRIPT_ERR_CHECKMULTISIGVERIFY:
            return "Script failed an OP_CHECKMULTISIGVERIFY operation";
        case SCRIPT_ERR_CHECKSIGVERIFY:
            return "Script failed an OP_CHECKSIGVERIFY operation";
        case SCRIPT_ERR_NUMEQUALVERIFY:
            return "Script failed an OP_NUMEQUALVERIFY operation";
        case SCRIPT_ERR_SCRIPT_SIZE:
            return "Script is too big";
        case SCRIPT_ERR_PUSH_SIZE:
            return "Push value size limit exceeded";
        case SCRIPT_ERR_OP_COUNT:
            return "Operation limit exceeded";
        case SCRIPT_ERR_STACK_SIZE:
            return "Stack size limit exceeded";
        case SCRIPT_ERR_SIG_COUNT:
            return "Signature count negative or greater than pubkey count";
        case SCRIPT_ERR_PUBKEY_COUNT:
            return "Pubkey count negative or limit exceeded";
        case SCRIPT_ERR_BAD_OPCODE:
            return "Opcode missing or not understood";
        case SCRIPT_ERR_DISABLED_OPCODE:
            return "Attempted to use a disabled opcode";
        case SCRIPT_ERR_INVALID_STACK_OPERATION:
            return "Operation not valid with the current stack size";
        case SCRIPT_ERR_INVALID_ALTSTACK_OPERATION:
            return "Operation not valid with the current altstack size";
        case SCRIPT_ERR_OP_RETURN:
            return "OP_RETURN was encountered";
        case SCRIPT_ERR_UNBALANCED_CONDITIONAL:
            return "Invalid OP_IF construction";
        case SCRIPT_ERR_NEGATIVE_LOCKTIME:
            return "Negative locktime";
        case SCRIPT_ERR_UNSATISFIED_LOCKTIME:
            return "Locktime requirement not satisfied";
        case SCRIPT_ERR_SIG_HASHTYPE:
            return "Signature hash type missing or not understood";
        case SCRIPT_ERR_SIG_DER:
            return "Non-canonical DER signature";
        case SCRIPT_ERR_MINIMALDATA:
            return "Data push larger than necessary";
        case SCRIPT_ERR_SIG_PUSHONLY:
            return "Only push operators allowed in signatures";
        case SCRIPT_ERR_SIG_HIGH_S:
            return "Non-canonical signature: S value is unnecessarily high";
        case SCRIPT_ERR_SIG_NULLDUMMY:
            return "Dummy CHECKMULTISIG argument must be zero";
        case SCRIPT_ERR_MINIMALIF:
            return "OP_IF/NOTIF argument must be minimal";
        case SCRIPT_ERR_SIG_NULLFAIL:
            return "Signature must be zero for failed CHECK(MULTI)SIG operation";
        case SCRIPT_ERR_DISCOURAGE_UPGRADABLE_NOPS:
            return "NOPx reserved for soft-fork upgrades";
        case SCRIPT_ERR_DISCOURAGE_UPGRADABLE_WITNESS_PROGRAM:
            return "Witness version reserved for soft-fork upgrades";
        case SCRIPT_ERR_DISCOURAGE_UPGRADABLE_TAPROOT_VERSION:
            return "Taproot version reserved for soft-fork upgrades";
        case SCRIPT_ERR_DISCOURAGE_OP_SUCCESS:
            return "OP_SUCCESSx reserved for soft-fork upgrades";
        case SCRIPT_ERR_DISCOURAGE_UPGRADABLE_PUBKEYTYPE:
            return "Public key version reserved for soft-fork upgrades";
        case SCRIPT_ERR_PUBKEYTYPE:
            return "Public key is neither compressed or uncompressed";
        case SCRIPT_ERR_CLEANSTACK:
            return "Stack size must be exactly one after execution";
        case SCRIPT_ERR_WITNESS_PROGRAM_WRONG_LENGTH:
            return "Witness program has incorrect length";
        case SCRIPT_ERR_WITNESS_PROGRAM_WITNESS_EMPTY:
            return "Witness program was passed an empty witness";
        case SCRIPT_ERR_WITNESS_PROGRAM_MISMATCH:
            return "Witness program hash mismatch";
        case SCRIPT_ERR_WITNESS_MALLEATED:
            return "Witness requires empty scriptSig";
        case SCRIPT_ERR_WITNESS_MALLEATED_P2SH:
            return "Witness requires only-redeemscript scriptSig";
        case SCRIPT_ERR_WITNESS_UNEXPECTED:
            return "Witness provided for non-witness script";
        case SCRIPT_ERR_WITNESS_PUBKEYTYPE:
            return "Using non-compressed keys in segwit";
        case SCRIPT_ERR_SCHNORR_SIG_SIZE:
            return "Invalid Schnorr signature size";
        case SCRIPT_ERR_SCHNORR_SIG_HASHTYPE:
            return "Invalid Schnorr signature hash type";
        case SCRIPT_ERR_SCHNORR_SIG:
            return "Invalid Schnorr signature";
        case SCRIPT_ERR_TAPROOT_WRONG_CONTROL_SIZE:
            return "Invalid Taproot control block size";
        case SCRIPT_ERR_TAPSCRIPT_VALIDATION_WEIGHT:
            return "Too much signature validation relative to witness weight";
        case SCRIPT_ERR_TAPSCRIPT_CHECKMULTISIG:
            return "OP_CHECKMULTISIG(VERIFY) is not available in tapscript";
        case SCRIPT_ERR_TAPSCRIPT_MINIMALIF:
            return "OP_IF/NOTIF argument must be minimal in tapscript";
        case SCRIPT_ERR_OP_CODESEPARATOR:
            return "Using OP_CODESEPARATOR in non-witness script";
        case SCRIPT_ERR_SIG_FINDANDDELETE:
            return "Signature is found in scriptCode";
        case SCRIPT_ERR_UNKNOWN_ERROR:
        case SCRIPT_ERR_ERROR_COUNT:
        default: break;
    }
    return "unknown error";
}